

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::handle
          (OpCodePreprocessor *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint id;
  bool bVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var2;
  SPIRExtension *pSVar3;
  SPIRVariable *pSVar4;
  SPIRType *pSVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  CompilerError *this_00;
  key_type_conflict var_id;
  uint32_t uVar8;
  uint32_t i;
  ulong uVar9;
  SPVFuncImpl spv_func;
  uint32_t result_type;
  uint32_t result_id;
  
  spv_func = get_spv_func_impl(this,opcode,args);
  if (spv_func != SPVFuncImplNone) {
    ::std::
    _Rb_tree<spirv_cross::CompilerMSL::SPVFuncImpl,spirv_cross::CompilerMSL::SPVFuncImpl,std::_Identity<spirv_cross::CompilerMSL::SPVFuncImpl>,std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>>
    ::_M_insert_unique<spirv_cross::CompilerMSL::SPVFuncImpl_const&>
              ((_Rb_tree<spirv_cross::CompilerMSL::SPVFuncImpl,spirv_cross::CompilerMSL::SPVFuncImpl,std::_Identity<spirv_cross::CompilerMSL::SPVFuncImpl>,std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>>
                *)&this->compiler->spv_function_implementations,&spv_func);
    this->suppress_missing_prototypes = true;
  }
  if (opcode - OpAtomicExchange < 0xe) {
LAB_001cba84:
    this->uses_atomics = true;
    _Var2._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->image_pointers_emulated)._M_h,args + 2);
    if (_Var2._M_cur != (__node_type *)0x0) {
      this->uses_image_write = true;
LAB_001cbaab:
      ::std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->compiler->atomic_image_vars_emulated,
               (value_type *)
               (((_Var2._M_cur)->
                super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>).
                super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>._M_storage
                ._M_storage.__data + 4));
      goto switchD_001cbad3_caseD_3a;
    }
    var_id = args[2];
LAB_001cbcfa:
    check_resource_write(this,var_id);
  }
  else {
    switch(opcode) {
    case OpFunctionCall:
      this->suppress_missing_prototypes = true;
      break;
    case OpFunctionEnd|OpSourceContinued:
    case OpVariable:
    case OpLoad:
    case OpCopyMemory:
    case OpCopyMemorySized:
      break;
    case OpImageTexelPointer:
      if ((this->compiler->msl_options).msl_version < 0x7594) {
        pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,args[2]);
        if (pSVar4 == (SPIRVariable *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (pSVar4->super_IVariant).self.id;
        }
        pmVar7 = ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->image_pointers_emulated,args + 1);
        *pmVar7 = uVar8;
      }
      break;
    case OpStore:
switchD_001cbad3_caseD_3e:
      var_id = *args;
      goto LAB_001cbcfa;
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpPtrAccessChain:
      result_type = *args;
      id = args[1];
      uVar8 = args[2];
      result_id._0_1_ = 1;
      Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                ((Compiler *)this->compiler,id,(char (*) [1])0x2a9b09,&result_type,
                 (bool *)&result_id);
      Compiler::register_read((Compiler *)this->compiler,id,uVar8,true);
      (this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
      super_VectorView<spirv_cross::Variant>.ptr[id].allow_type_rewrite = true;
      break;
    case OpArrayLength:
      pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,args[2]);
      if ((pSVar4 != (SPIRVariable *)0x0) &&
         (bVar1 = is_var_runtime_size_array(this->compiler,pSVar4), !bVar1)) {
        result_type = (pSVar4->super_IVariant).self.id;
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&this->compiler->buffers_requiring_array_length,&result_type);
      }
      break;
    default:
      if (opcode - OpGroupNonUniformBallotFindLSB < 2) {
LAB_001cbbd0:
        this->needs_subgroup_size = true;
        break;
      }
      if (opcode == OpExtInst) {
        pSVar3 = Compiler::get<spirv_cross::SPIRExtension>((Compiler *)this->compiler,args[2]);
        if ((*(int *)&(pSVar3->super_IVariant).field_0xc == 1) && (args[3] - 0x4c < 3)) {
          if ((this->compiler->msl_options).msl_version < 0x4f4c) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"Pull-model interpolation requires MSL 2.3.");
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,args[4]);
          if (pSVar4 != (SPIRVariable *)0x0) {
            result_type = (pSVar4->super_IVariant).self.id;
            ::std::__detail::
            _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&this->compiler->pull_model_inputs,&result_type);
            pSVar5 = Compiler::get_variable_element_type((Compiler *)this->compiler,pSVar4);
            bVar1 = Compiler::has_decoration
                              ((Compiler *)this->compiler,(ID)(pSVar4->super_IVariant).self.id,
                               DecorationSample);
            if (!bVar1) {
              if (pSVar5->basetype != Struct) break;
              uVar9 = 0;
              do {
                if ((pSVar5->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size <=
                    uVar9) goto switchD_001cbad3_caseD_3a;
                bVar1 = Compiler::has_member_decoration
                                  ((Compiler *)this->compiler,
                                   (TypeID)(pSVar5->super_IVariant).self.id,(uint32_t)uVar9,
                                   DecorationSample);
                uVar9 = (ulong)((uint32_t)uVar9 + 1);
              } while (!bVar1);
            }
            this->needs_sample_id = true;
          }
        }
        break;
      }
      if (opcode != OpImageWrite) {
        if (opcode == OpAtomicLoad) {
          this->uses_atomics = true;
          _Var2._M_cur = (__node_type *)
                         ::std::
                         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(&(this->image_pointers_emulated)._M_h,args + 2);
          if (_Var2._M_cur == (__node_type *)0x0) break;
          goto LAB_001cbaab;
        }
        if (opcode != OpAtomicStore) {
          if (opcode != OpGroupNonUniformInverseBallot) {
            if (opcode != OpGroupNonUniformBallotBitCount) {
              if (opcode == OpDemoteToHelperInvocation) {
                this->uses_discard = true;
                break;
              }
              if (opcode == OpIsHelperInvocationEXT) {
                if (((this->compiler->msl_options).manual_helper_invocation_updates == true) &&
                   (0x4f4b < (this->compiler->msl_options).msl_version)) {
                  this->needs_helper_invocation = true;
                }
                break;
              }
              if (opcode != OpAtomicFAddEXT) break;
              goto LAB_001cba84;
            }
            if (args[3] == 0) goto LAB_001cbbd0;
          }
          this->needs_subgroup_invocation_id = true;
          break;
        }
        this->uses_atomics = true;
        iVar6 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->image_pointers_emulated)._M_h,args);
        if (iVar6.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) goto switchD_001cbad3_caseD_3e;
        ::std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->compiler->atomic_image_vars_emulated,
                 (value_type *)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 0xc));
      }
      this->uses_image_write = true;
    }
  }
switchD_001cbad3_caseD_3a:
  bVar1 = Compiler::instruction_to_result_type
                    ((Compiler *)this->compiler,&result_type,&result_id,opcode,args,length);
  uVar8 = result_type;
  if (bVar1) {
    pmVar7 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->result_types,&result_id);
    *pmVar7 = uVar8;
  }
  return true;
}

Assistant:

bool CompilerMSL::OpCodePreprocessor::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// Since MSL exists in a single execution scope, function prototype declarations are not
	// needed, and clutter the output. If secondary functions are output (either as a SPIR-V
	// function implementation or as indicated by the presence of OpFunctionCall), then set
	// suppress_missing_prototypes to suppress compiler warnings of missing function prototypes.

	// Mark if the input requires the implementation of an SPIR-V function that does not exist in Metal.
	SPVFuncImpl spv_func = get_spv_func_impl(opcode, args);
	if (spv_func != SPVFuncImplNone)
	{
		compiler.spv_function_implementations.insert(spv_func);
		suppress_missing_prototypes = true;
	}

	switch (opcode)
	{

	case OpFunctionCall:
		suppress_missing_prototypes = true;
		break;

	case OpDemoteToHelperInvocationEXT:
		uses_discard = true;
		break;

	// Emulate texture2D atomic operations
	case OpImageTexelPointer:
	{
		if (!compiler.msl_options.supports_msl_version(3, 1))
		{
			auto *var = compiler.maybe_get_backing_variable(args[2]);
			image_pointers_emulated[args[1]] = var ? var->self : ID(0);
		}
		break;
	}

	case OpImageWrite:
		uses_image_write = true;
		break;

	case OpStore:
		check_resource_write(args[0]);
		break;

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicFAddEXT:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	{
		uses_atomics = true;
		auto it = image_pointers_emulated.find(args[2]);
		if (it != image_pointers_emulated.end())
		{
			uses_image_write = true;
			compiler.atomic_image_vars_emulated.insert(it->second);
		}
		else
			check_resource_write(args[2]);
		break;
	}

	case OpAtomicStore:
	{
		uses_atomics = true;
		auto it = image_pointers_emulated.find(args[0]);
		if (it != image_pointers_emulated.end())
		{
			compiler.atomic_image_vars_emulated.insert(it->second);
			uses_image_write = true;
		}
		else
			check_resource_write(args[0]);
		break;
	}

	case OpAtomicLoad:
	{
		uses_atomics = true;
		auto it = image_pointers_emulated.find(args[2]);
		if (it != image_pointers_emulated.end())
		{
			compiler.atomic_image_vars_emulated.insert(it->second);
		}
		break;
	}

	case OpGroupNonUniformInverseBallot:
		needs_subgroup_invocation_id = true;
		break;

	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
		needs_subgroup_size = true;
		break;

	case OpGroupNonUniformBallotBitCount:
		if (args[3] == GroupOperationReduce)
			needs_subgroup_size = true;
		else
			needs_subgroup_invocation_id = true;
		break;

	case OpArrayLength:
	{
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var != nullptr)
		{
			if (!compiler.is_var_runtime_size_array(*var))
				compiler.buffers_requiring_array_length.insert(var->self);
		}
		break;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		// OpArrayLength might want to know if taking ArrayLength of an array of SSBOs.
		uint32_t result_type = args[0];
		uint32_t id = args[1];
		uint32_t ptr = args[2];

		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		compiler.ir.ids[id].set_allow_type_rewrite();
		break;
	}

	case OpExtInst:
	{
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450InterpolateAtCentroid:
			case GLSLstd450InterpolateAtSample:
			case GLSLstd450InterpolateAtOffset:
			{
				if (!compiler.msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Pull-model interpolation requires MSL 2.3.");
				// Fragment varyings used with pull-model interpolation need special handling,
				// due to the way pull-model interpolation works in Metal.
				auto *var = compiler.maybe_get_backing_variable(args[4]);
				if (var)
				{
					compiler.pull_model_inputs.insert(var->self);
					auto &var_type = compiler.get_variable_element_type(*var);
					// In addition, if this variable has a 'Sample' decoration, we need the sample ID
					// in order to do default interpolation.
					if (compiler.has_decoration(var->self, DecorationSample))
					{
						needs_sample_id = true;
					}
					else if (var_type.basetype == SPIRType::Struct)
					{
						// Now we need to check each member and see if it has this decoration.
						for (uint32_t i = 0; i < var_type.member_types.size(); ++i)
						{
							if (compiler.has_member_decoration(var_type.self, i, DecorationSample))
							{
								needs_sample_id = true;
								break;
							}
						}
					}
				}
				break;
			}
			default:
				break;
			}
		}
		break;
	}

	case OpIsHelperInvocationEXT:
		if (compiler.needs_manual_helper_invocation_updates())
			needs_helper_invocation = true;
		break;

	default:
		break;
	}

	// If it has one, keep track of the instruction's result type, mapped by ID
	uint32_t result_type, result_id;
	if (compiler.instruction_to_result_type(result_type, result_id, opcode, args, length))
		result_types[result_id] = result_type;

	return true;
}